

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O2

genxAttribute_conflict
declareAttribute(genxWriter w,genxNamespace ns,constUtf8 name,constUtf8 valuestr,genxStatus *statusP
                )

{
  collector *c;
  void **ppvVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  genxStatus gVar6;
  genxAttribute_conflict pgVar7;
  undefined4 extraout_var;
  size_t sVar8;
  genxAttribute_conflict pgVar9;
  ulong uVar10;
  
  ppvVar1 = (w->attributes).pointers;
  (w->arec).ns = ns;
  (w->arec).name = name;
  if (ns == (genxNamespace)0x0) {
    iVar3 = strncmp((char *)name,"xmlns",5);
    (w->arec).atype = (uint)(iVar3 != 0);
  }
  else {
    (w->arec).atype = ATTR_PREFIXED;
    if (ns->defaultDecl == w->xmlnsEquals) {
      w->status = GENX_ATTRIBUTE_IN_DEFAULT_NAMESPACE;
      gVar6 = GENX_ATTRIBUTE_IN_DEFAULT_NAMESPACE;
      pgVar9 = (genxAttribute_conflict)0x0;
      goto LAB_001c9516;
    }
  }
  uVar10 = 0xffffffffffffffff;
  iVar3 = (w->attributes).count;
  while (iVar5 = (int)uVar10, 1 < iVar3 - iVar5) {
    uVar2 = (long)(iVar3 + iVar5) / 2;
    iVar5 = (int)uVar2;
    iVar4 = orderAttributes(&w->arec,(genxAttribute_conflict)ppvVar1[iVar5]);
    if (-1 < iVar4) {
      uVar10 = uVar2;
    }
    uVar10 = uVar10 & 0xffffffff;
    if (-1 >= iVar4) {
      iVar3 = iVar5;
    }
  }
  if (iVar5 != -1) {
    pgVar7 = (genxAttribute_conflict)ppvVar1[iVar5];
    iVar5 = orderAttributes(&w->arec,pgVar7);
    if (iVar5 == 0) {
      return pgVar7;
    }
  }
  pgVar7 = (genxAttribute_conflict)allocate(w,0x30);
  if (pgVar7 == (genxAttribute_conflict)0x0) {
LAB_001c9504:
    w->status = GENX_ALLOC_FAILED;
    gVar6 = GENX_ALLOC_FAILED;
  }
  else {
    pgVar7->writer = w;
    pgVar7->ns = ns;
    pgVar7->provided = 0;
    pgVar7->atype = (w->arec).atype;
    iVar5 = copy((EVP_PKEY_CTX *)w,(EVP_PKEY_CTX *)name);
    pgVar7->name = (utf8)CONCAT44(extraout_var,iVar5);
    if ((utf8)CONCAT44(extraout_var,iVar5) == (utf8)0x0) goto LAB_001c9504;
    c = &pgVar7->value;
    gVar6 = initCollector(w,c);
    w->status = gVar6;
    if (gVar6 == GENX_SUCCESS) {
      if (valuestr != (constUtf8)0x0) {
        sVar8 = strlen((char *)valuestr);
        if ((pgVar7->value).space <= (int)sVar8) {
          gVar6 = growCollector(w,c,(int)sVar8);
          w->status = gVar6;
          if (gVar6 != GENX_SUCCESS) goto LAB_001c9504;
        }
        strcpy((char *)c->buf,(char *)valuestr);
        w->status = GENX_SUCCESS;
      }
      gVar6 = listInsert(&w->attributes,pgVar7,iVar3);
      w->status = gVar6;
      pgVar9 = (genxAttribute_conflict)0x0;
      if (gVar6 == GENX_SUCCESS) {
        pgVar9 = pgVar7;
      }
      goto LAB_001c9516;
    }
  }
  pgVar9 = (genxAttribute_conflict)0x0;
LAB_001c9516:
  *statusP = gVar6;
  return pgVar9;
}

Assistant:

static genxAttribute declareAttribute(genxWriter w, genxNamespace ns,
				      constUtf8 name, constUtf8 valuestr,
				      genxStatus * statusP)
{
  int high, low;
  genxAttribute * aa = (genxAttribute *) w->attributes.pointers;
  genxAttribute a;

  w->arec.ns = ns;
  w->arec.name = (utf8) name;

  if (ns)
    w->arec.atype = ATTR_PREFIXED;
  else if (strncmp((const char *) name, "xmlns", STRLEN_XMLNS_COLON - 1) == 0)
    w->arec.atype = ATTR_NSDECL;
  else
    w->arec.atype = ATTR_NAKED;

  if (ns && (ns->defaultDecl == w->xmlnsEquals))
  {
    w->status = GENX_ATTRIBUTE_IN_DEFAULT_NAMESPACE;
    goto busted;
  }

  /* attribute list has to be kept sorted per c14n rules */
  high = w->attributes.count; low = -1;
  while (high - low > 1)
  {
    int probe = (high + low) / 2;
    if (orderAttributes(&w->arec, aa[probe]) < 0)
      high = probe;
    else
      low = probe;
  }

  /* if it was already there */
  if (low != -1 && orderAttributes(&w->arec, aa[low]) == 0)
    return aa[low];

  /* not there, build it */
  a = (genxAttribute) allocate(w, sizeof(struct genxAttribute_rec));
  if (a == NULL)
  {
    w->status = GENX_ALLOC_FAILED;
    goto busted;
  }

  a->writer = w;
  a->ns = ns;
  a->provided = False;
  a->atype = w->arec.atype;

  if ((a->name = copy(w, name)) == NULL)
  {
    w->status = GENX_ALLOC_FAILED;
    goto busted;
  }

  if ((w->status = initCollector(w, &a->value)) != GENX_SUCCESS)
    goto busted;

  if (valuestr)
    if ((w->status = collectString(w, &a->value, valuestr)) != GENX_SUCCESS)
      goto busted;
  
  w->status = listInsert(&w->attributes, a, high);
  if (w->status != GENX_SUCCESS)
    goto busted;
  
  *statusP = GENX_SUCCESS;
  return a;

busted:
  *statusP = w->status;
  return NULL;
}